

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_repl.c
# Opt level: O2

void repl_p_lru_use(repl_p_head *head,repl_p_entry **ptr_entry)

{
  repl_p_entry *prVar1;
  repl_p_entry *data;
  int iVar2;
  
  data = *ptr_entry;
  if (data != (repl_p_entry *)0x0) {
    LOCK();
    prVar1 = *ptr_entry;
    if (data == prVar1) {
      *ptr_entry = (repl_p_entry *)0x0;
    }
    UNLOCK();
    if (data == prVar1) {
      while (iVar2 = ringbuf_tryenqueue(head->ringbuf,data), iVar2 != 0) {
        util_mutex_lock(&head->lock);
        dequeue_all(head);
        util_mutex_unlock(&head->lock);
      }
    }
  }
  return;
}

Assistant:

static void
repl_p_lru_use(struct repl_p_head *head, struct repl_p_entry **ptr_entry)
{
	struct repl_p_entry *entry;

	ASSERTne(ptr_entry, NULL);

	entry = *ptr_entry;
	if (entry == NULL)
		return;

	/*
	 * Try to lock the entry by setting 'ptr_entry' to NULL
	 * and enqueue it to the ring buffer,
	 * so that it cannot be used nor evicted.
	 */
	if (!util_bool_compare_and_swap64(ptr_entry, entry, NULL))
		return;

	/*
	 * This the "in the middle of being used" state.
	 * In this state - after bool_compare_and_swap()
	 * and before ringbuf_tryenqueue() - the entry cannot be evicted.
	 */

	while (ringbuf_tryenqueue(head->ringbuf, entry) != 0) {
		util_mutex_lock(&head->lock);
		dequeue_all(head);
		util_mutex_unlock(&head->lock);
	}
}